

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

void sysbvm_type_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_createSimpleFunctionType,"SimpleFunctionTypeTemplate");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_createSequenceTupleTemplate,"SequenceTupleTemplate");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_createPointerType,"PointerTypeTemplate");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_createReferenceType,"ReferenceTypeTemplate");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_createTemporaryReferenceType,"TemporaryReferenceTypeTemplate");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_pointerLikeLoad,"PointerLikeType::load");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_pointerLikeStore,"PointerLikeType::store:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_pointerLikeTypeElementAt,"PointerLikeType::at:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_pointerLikeTypeReinterpretCast,"PointerLikeType::reinterpretCast"
            );
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo,
             "PointerType::reinterpretCastTo:");
  sysbvm_primitiveTable_registerFunction(sysbvm_void_primitive_anyValueToVoid,"Void::fromAnyValue");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_void_primitive_coerceASTNodeWithEnvironment,
             "Void::coerceASTNode:withEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_coerceASTNodeWithEnvironment,
             "Type::coerceASTNode:withEnvironment:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_flushLookupSelector,"Type::flushLookupSelector:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_flushMacroLookupSelector,"Type::flushMacroLookupSelector:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_type_primitive_flushFallbackLookupSelector,"Type::flushFallbackLookupSelector:")
  ;
  return;
}

Assistant:

void sysbvm_type_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_createSimpleFunctionType, "SimpleFunctionTypeTemplate");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_createSequenceTupleTemplate, "SequenceTupleTemplate");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_createPointerType, "PointerTypeTemplate");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_createReferenceType, "ReferenceTypeTemplate");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_createTemporaryReferenceType, "TemporaryReferenceTypeTemplate");

    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_pointerLikeLoad, "PointerLikeType::load");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_pointerLikeStore, "PointerLikeType::store:");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_pointerLikeTypeElementAt, "PointerLikeType::at:");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_pointerLikeTypeReinterpretCast, "PointerLikeType::reinterpretCast");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_pointerLikeTypeReinterpretCastTo, "PointerType::reinterpretCastTo:");
    
    sysbvm_primitiveTable_registerFunction(sysbvm_void_primitive_anyValueToVoid, "Void::fromAnyValue");
    sysbvm_primitiveTable_registerFunction(sysbvm_void_primitive_coerceASTNodeWithEnvironment, "Void::coerceASTNode:withEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_coerceASTNodeWithEnvironment, "Type::coerceASTNode:withEnvironment:");

    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_flushLookupSelector, "Type::flushLookupSelector:");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_flushMacroLookupSelector, "Type::flushMacroLookupSelector:");
    sysbvm_primitiveTable_registerFunction(sysbvm_type_primitive_flushFallbackLookupSelector, "Type::flushFallbackLookupSelector:");
}